

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sceneobject.cpp
# Opt level: O1

void __thiscall SceneObject::SceneObject(SceneObject *this,mat4 *ltw,ColorRGB c)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  value_type local_58;
  value_type local_54;
  value_type local_50;
  value_type local_4c;
  value_type local_48;
  value_type local_44;
  value_type local_40;
  value_type local_3c;
  value_type local_38;
  value_type local_34;
  value_type local_30;
  value_type local_2c;
  value_type local_28;
  value_type local_24;
  value_type local_20;
  value_type local_1c;
  
  this->_vptr_SceneObject = (_func_int **)&PTR__SceneObject_0010cd58;
  ColorRGB::ColorRGB(&this->color);
  *(undefined8 *)&(this->position).field_0 = 0;
  *(undefined8 *)((long)&(this->position).field_0 + 8) = 0;
  *(undefined8 *)((long)&(this->localToWorld).value[1].field_0 + 4) = 0;
  *(undefined8 *)((long)&(this->localToWorld).value[1].field_0 + 0xc) = 0;
  *(undefined8 *)((long)&(this->localToWorld).value[2].field_0 + 4) = 0;
  *(undefined8 *)((long)&(this->localToWorld).value[2].field_0 + 0xc) = 0;
  *(undefined8 *)&(this->localToWorld).value[3].field_0 = 0;
  *(undefined8 *)((long)&(this->localToWorld).value[3].field_0 + 8) = 0;
  (this->localToWorld).value[0].field_0.field_0.x = 1.0;
  *(undefined8 *)((long)&(this->localToWorld).value[0].field_0 + 4) = 0;
  *(undefined8 *)((long)&(this->localToWorld).value[0].field_0 + 0xc) = 0;
  (this->localToWorld).value[1].field_0.field_0.y = 1.0;
  *(undefined8 *)((long)&(this->localToWorld).value[1].field_0 + 8) = 0;
  *(undefined8 *)&(this->localToWorld).value[2].field_0 = 0;
  (this->localToWorld).value[2].field_0.field_0.z = 1.0;
  *(undefined8 *)((long)&(this->localToWorld).value[2].field_0 + 0xc) = 0;
  *(undefined8 *)((long)&(this->localToWorld).value[3].field_0 + 4) = 0;
  (this->localToWorld).value[3].field_0.field_0.w = 1.0;
  *(undefined8 *)&(this->worldToLocal).value[0].field_0 = 0;
  *(undefined8 *)((long)&(this->worldToLocal).value[0].field_0 + 8) = 0;
  *(undefined8 *)&(this->worldToLocal).value[1].field_0 = 0;
  *(undefined8 *)((long)&(this->worldToLocal).value[1].field_0 + 8) = 0;
  *(undefined8 *)&(this->worldToLocal).value[2].field_0 = 0;
  *(undefined8 *)((long)&(this->worldToLocal).value[2].field_0 + 8) = 0;
  *(undefined8 *)&(this->worldToLocal).value[3].field_0 = 0;
  *(undefined8 *)((long)&(this->worldToLocal).value[3].field_0 + 8) = 0;
  (this->worldToLocal).value[0].field_0.field_0.x = 1.0;
  *(undefined8 *)((long)&(this->worldToLocal).value[0].field_0 + 4) = 0;
  *(undefined8 *)((long)&(this->worldToLocal).value[0].field_0 + 0xc) = 0;
  (this->worldToLocal).value[1].field_0.field_0.y = 1.0;
  *(undefined8 *)((long)&(this->worldToLocal).value[1].field_0 + 8) = 0;
  *(undefined8 *)&(this->worldToLocal).value[2].field_0 = 0;
  (this->worldToLocal).value[2].field_0.field_0.z = 1.0;
  *(undefined8 *)((long)&(this->worldToLocal).value[2].field_0 + 0xc) = 0;
  *(undefined8 *)((long)&(this->worldToLocal).value[3].field_0 + 4) = 0;
  (this->worldToLocal).value[3].field_0.field_0.w = 1.0;
  (this->localToWorld).value[0].field_0.field_0.x = ltw->value[0].field_0.field_0.x;
  (this->localToWorld).value[0].field_0.field_0.y = ltw->value[0].field_0.field_0.y;
  (this->localToWorld).value[0].field_0.field_0.z = ltw->value[0].field_0.field_0.z;
  (this->localToWorld).value[0].field_0.field_0.w = ltw->value[0].field_0.field_0.w;
  (this->localToWorld).value[1].field_0.field_0.x = ltw->value[1].field_0.field_0.x;
  (this->localToWorld).value[1].field_0.field_0.y = ltw->value[1].field_0.field_0.y;
  (this->localToWorld).value[1].field_0.field_0.z = ltw->value[1].field_0.field_0.z;
  (this->localToWorld).value[1].field_0.field_0.w = ltw->value[1].field_0.field_0.w;
  (this->localToWorld).value[2].field_0.field_0.x = ltw->value[2].field_0.field_0.x;
  (this->localToWorld).value[2].field_0.field_0.y = ltw->value[2].field_0.field_0.y;
  (this->localToWorld).value[2].field_0.field_0.z = ltw->value[2].field_0.field_0.z;
  (this->localToWorld).value[2].field_0.field_0.w = ltw->value[2].field_0.field_0.w;
  (this->localToWorld).value[3].field_0.field_0.x = ltw->value[3].field_0.field_0.x;
  (this->localToWorld).value[3].field_0.field_0.y = ltw->value[3].field_0.field_0.y;
  (this->localToWorld).value[3].field_0.field_0.z = ltw->value[3].field_0.field_0.z;
  (this->localToWorld).value[3].field_0.field_0.w = ltw->value[3].field_0.field_0.w;
  glm::inverse<float>(ltw);
  (this->worldToLocal).value[0].field_0.field_0.x = local_58;
  (this->worldToLocal).value[0].field_0.field_0.y = local_54;
  (this->worldToLocal).value[0].field_0.field_0.z = local_50;
  (this->worldToLocal).value[0].field_0.field_0.w = local_4c;
  (this->worldToLocal).value[1].field_0.field_0.x = local_48;
  (this->worldToLocal).value[1].field_0.field_0.y = local_44;
  (this->worldToLocal).value[1].field_0.field_0.z = local_40;
  (this->worldToLocal).value[1].field_0.field_0.w = local_3c;
  (this->worldToLocal).value[2].field_0.field_0.x = local_38;
  (this->worldToLocal).value[2].field_0.field_0.y = local_34;
  (this->worldToLocal).value[2].field_0.field_0.z = local_30;
  (this->worldToLocal).value[2].field_0.field_0.w = local_2c;
  (this->worldToLocal).value[3].field_0.field_0.x = local_28;
  (this->worldToLocal).value[3].field_0.field_0.y = local_24;
  (this->worldToLocal).value[3].field_0.field_0.z = local_20;
  (this->worldToLocal).value[3].field_0.field_0.w = local_1c;
  (this->color).r = (float)(int)c._0_8_;
  (this->color).g = (float)(int)((ulong)c._0_8_ >> 0x20);
  (this->color).b = c.b;
  fVar1 = ltw->value[1].field_0.field_0.y;
  fVar2 = ltw->value[0].field_0.field_0.y;
  fVar3 = ltw->value[2].field_0.field_0.y;
  fVar4 = ltw->value[3].field_0.field_0.y;
  fVar5 = ltw->value[1].field_0.field_0.z;
  fVar6 = ltw->value[0].field_0.field_0.z;
  fVar7 = ltw->value[2].field_0.field_0.z;
  fVar8 = ltw->value[3].field_0.field_0.z;
  (this->position).field_0.field_0.x =
       ltw->value[2].field_0.field_0.x * 0.0 +
       ltw->value[0].field_0.field_0.x * 0.0 + ltw->value[1].field_0.field_0.x * 0.0 +
       ltw->value[3].field_0.field_0.x;
  (this->position).field_0.field_0.y = fVar3 * 0.0 + fVar2 * 0.0 + fVar1 * 0.0 + fVar4;
  (this->position).field_0.field_0.z = fVar7 * 0.0 + fVar6 * 0.0 + fVar5 * 0.0 + fVar8;
  return;
}

Assistant:

SceneObject::SceneObject(const glm::mat4 &ltw, ColorRGB c) {
    localToWorld = ltw;
    worldToLocal = glm::inverse(ltw);
    color = c;
    
    position = glm::vec3(ltw * glm::vec4(0, 0, 0, 1)); //poor mans swizzling
}